

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

int resampler_basic_zero
              (SpeexResamplerState *st,uint channel_index,spx_word16_t *in,uint *in_len,
              spx_word16_t *out,uint *out_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  uint den_rate;
  int frac_advance;
  int int_advance;
  int out_stride;
  uint samp_frac_num;
  int last_sample;
  int out_sample;
  uint *out_len_local;
  spx_word16_t *out_local;
  uint *in_len_local;
  spx_word16_t *in_local;
  uint channel_index_local;
  SpeexResamplerState *st_local;
  
  out_sample = 0;
  last_sample = st->last_sample[channel_index];
  samp_frac_num = st->samp_frac_num[channel_index];
  iVar1 = st->out_stride;
  iVar2 = st->int_advance;
  iVar3 = st->frac_advance;
  uVar4 = st->den_rate;
  while( true ) {
    bVar5 = true;
    if (last_sample < (int)*in_len) {
      bVar5 = (int)*out_len <= out_sample;
    }
    if (bVar5) break;
    iVar6 = out_sample + 1;
    out[iVar1 * out_sample] = 0.0;
    last_sample = iVar2 + last_sample;
    samp_frac_num = iVar3 + samp_frac_num;
    out_sample = iVar6;
    if (uVar4 <= samp_frac_num) {
      samp_frac_num = samp_frac_num - uVar4;
      last_sample = last_sample + 1;
    }
  }
  st->last_sample[channel_index] = last_sample;
  st->samp_frac_num[channel_index] = samp_frac_num;
  return out_sample;
}

Assistant:

static int resampler_basic_zero(SpeexResamplerState *st, spx_uint32_t channel_index, const spx_word16_t *in, spx_uint32_t *in_len, spx_word16_t *out, spx_uint32_t *out_len)
{
   int out_sample = 0;
   int last_sample = st->last_sample[channel_index];
   spx_uint32_t samp_frac_num = st->samp_frac_num[channel_index];
   const int out_stride = st->out_stride;
   const int int_advance = st->int_advance;
   const int frac_advance = st->frac_advance;
   const spx_uint32_t den_rate = st->den_rate;

   while (!(last_sample >= (spx_int32_t)*in_len || out_sample >= (spx_int32_t)*out_len))
   {
      out[out_stride * out_sample++] = 0;
      last_sample += int_advance;
      samp_frac_num += frac_advance;
      if (samp_frac_num >= den_rate)
      {
         samp_frac_num -= den_rate;
         last_sample++;
      }
   }

   st->last_sample[channel_index] = last_sample;
   st->samp_frac_num[channel_index] = samp_frac_num;
   return out_sample;
}